

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::ConvertTimeStampMacroString(char *str,time_t *tmt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  time_t tVar8;
  bool bVar9;
  char buffer [27];
  tm tmt2;
  
  if ((tmt != (time_t *)0x0 && str != (char *)0x0) && (sVar6 = strlen(str), sVar6 < 0x1b)) {
    strcpy(buffer,str);
    buffer[7] = '\0';
    pcVar7 = strstr(ConvertTimeStampMacroString::month_names,buffer + 4);
    bVar9 = pcVar7 != (char *)0x0;
    if (!bVar9) {
      return bVar9;
    }
    iVar1 = atoi(buffer + 8);
    iVar2 = atoi(buffer + 0xb);
    iVar3 = atoi(buffer + 0xe);
    iVar4 = atoi(buffer + 0x11);
    iVar5 = atoi(buffer + 0x14);
    tmt2.tm_isdst = -1;
    tmt2.tm_wday = 0;
    tmt2.tm_yday = 0;
    tmt2.tm_mon = (int)((long)(pcVar7 + -0x11b4b0) / 3);
    tmt2.tm_year = iVar5 + -0x76c;
    tmt2.tm_sec = iVar4;
    tmt2.tm_min = iVar3;
    tmt2.tm_hour = iVar2;
    tmt2.tm_mday = iVar1;
    tVar8 = mktime((tm *)&tmt2);
    *tmt = tVar8;
    return bVar9;
  }
  return false;
}

Assistant:

bool SystemTools::ConvertTimeStampMacroString(const char* str, time_t* tmt)
{
  if (!str || !tmt || strlen(str) > 26) {
    return false;
  }

  struct tm tmt2;

  // __TIMESTAMP__
  // The date and time of the last modification of the current source file,
  // expressed as a string literal in the form Ddd Mmm Date hh:mm:ss yyyy,
  /// where Ddd is the abbreviated day of the week and Date is an integer
  // from 1 to 31.

  // index:   0123456789
  //                    0123456789
  //                              0123456789
  // format:  Ddd Mmm Date hh:mm:ss yyyy
  // example: Fri Dec 19 14:34:58 2003

  static char month_names[] = "JanFebMarAprMayJunJulAugSepOctNovDec";

  char buffer[27];
  strcpy(buffer, str);

  buffer[7] = 0;
  char* ptr = strstr(month_names, buffer + 4);
  if (!ptr) {
    return false;
  }

  int month = static_cast<int>((ptr - month_names) / 3);
  int day = atoi(buffer + 8);
  int hour = atoi(buffer + 11);
  int min = atoi(buffer + 14);
  int sec = atoi(buffer + 17);
  int year = atoi(buffer + 20);

  tmt2.tm_isdst = -1;
  tmt2.tm_hour = hour;
  tmt2.tm_min = min;
  tmt2.tm_sec = sec;
  tmt2.tm_wday = 0;
  tmt2.tm_yday = 0;
  tmt2.tm_mday = day;
  tmt2.tm_mon = month;
  tmt2.tm_year = year - 1900;

  *tmt = mktime(&tmt2);
  return true;
}